

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::OptimizeLinkDependencies
          (cmComputeTargetDepends *this,cmGeneratorTarget *gt,cmGraphEdgeList *outputEdges,
          cmGraphEdgeList *inputEdges)

{
  mapped_type_conflict1 mVar1;
  bool bVar2;
  reference this_00;
  size_t sVar3;
  reference this_01;
  pointer ppVar4;
  reference ppcVar5;
  mapped_type_conflict1 *pmVar6;
  size_type sVar7;
  cmListFileBacktrace *pcVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar9;
  cmListFileBacktrace local_1c0;
  cmGraphEdge local_1b0;
  _Base_ptr local_190;
  undefined1 local_188;
  mapped_type_conflict1 local_180;
  mapped_type_conflict1 index_1;
  cmGeneratorTarget *dep_1;
  iterator __end5;
  iterator __begin5;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range5;
  _Self local_150;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lang;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  cmGraphEdge local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  mapped_type_conflict1 local_b8;
  mapped_type_conflict1 index;
  cmGeneratorTarget *dep;
  iterator __end3;
  iterator __begin3;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range3;
  value_type *dse;
  cmGraphEdge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  cmGraphEdgeList *__range1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> emitted;
  cmGraphEdgeList *inputEdges_local;
  cmGraphEdgeList *outputEdges_local;
  cmGeneratorTarget *gt_local;
  cmComputeTargetDepends *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)inputEdges;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &__range1);
  sVar3 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                     ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
                      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  edge = (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)sVar3);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                     *)&edge), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator*(&__end1);
    bVar2 = cmGraphEdge::IsStrong(this_00);
    if (bVar2) {
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,this_00);
    }
    else {
      sVar3 = cmGraphEdge::operator_cast_to_unsigned_long(this_00);
      this_01 = std::
                vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ::operator[](&this->SideEffects,sVar3);
      __end3 = std::
               set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               ::begin(&this_01->CustomCommandSideEffects);
      dep = (cmGeneratorTarget *)
            std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::end(&this_01->CustomCommandSideEffects);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&dep), bVar2) {
        ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end3);
        index = (mapped_type_conflict1)*ppcVar5;
        pmVar6 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::operator[](&this->TargetIndex,(key_type *)&index);
        local_b8 = *pmVar6;
        sVar7 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&__range1,&local_b8);
        if (sVar7 == 0) {
          pVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&__range1,&local_b8);
          mVar1 = local_b8;
          local_c8 = (_Base_ptr)pVar9.first._M_node;
          local_c0 = pVar9.second;
          bVar2 = cmGraphEdge::IsCross(this_00);
          pcVar8 = cmGraphEdge::GetBacktrace(this_00);
          cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range3_1,pcVar8);
          cmGraphEdge::cmGraphEdge(&local_e8,mVar1,false,bVar2,(cmListFileBacktrace *)&__range3_1);
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                    (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_e8
                    );
          cmGraphEdge::~cmGraphEdge(&local_e8);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range3_1);
        }
        std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end3);
      }
      cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__begin3_1,gt);
      __end3_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin3_1);
      lang = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin3_1);
      while (bVar2 = std::operator!=(&__end3_1,(_Self *)&lang), bVar2) {
        it._M_node = (_Base_ptr)
                     std::
                     _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end3_1);
        local_150._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             ::find(&this_01->LanguageSideEffects,(key_type *)it._M_node);
        __range5 = (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                      ::end(&this_01->LanguageSideEffects);
        bVar2 = std::operator!=(&local_150,(_Self *)&__range5);
        if (bVar2) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
                   ::operator->(&local_150);
          __end5 = std::
                   set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   ::begin(&ppVar4->second);
          dep_1 = (cmGeneratorTarget *)
                  std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::end(&ppVar4->second);
          while (bVar2 = std::operator!=(&__end5,(_Self *)&dep_1), bVar2) {
            ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end5);
            index_1 = (mapped_type_conflict1)*ppcVar5;
            pmVar6 = std::
                     map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                     ::operator[](&this->TargetIndex,(key_type *)&index_1);
            local_180 = *pmVar6;
            sVar7 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&__range1,&local_180);
            if (sVar7 == 0) {
              pVar9 = std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)&__range1,&local_180);
              mVar1 = local_180;
              local_190 = (_Base_ptr)pVar9.first._M_node;
              local_188 = pVar9.second;
              bVar2 = cmGraphEdge::IsCross(this_00);
              pcVar8 = cmGraphEdge::GetBacktrace(this_00);
              cmListFileBacktrace::cmListFileBacktrace(&local_1c0,pcVar8);
              cmGraphEdge::cmGraphEdge(&local_1b0,mVar1,false,bVar2,&local_1c0);
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                        (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                         &local_1b0);
              cmGraphEdge::~cmGraphEdge(&local_1b0);
              cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
            }
            std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end5);
          }
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_1);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin3_1);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&__end1);
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &__range1);
  return;
}

Assistant:

void cmComputeTargetDepends::OptimizeLinkDependencies(
  cmGeneratorTarget const* gt, cmGraphEdgeList& outputEdges,
  cmGraphEdgeList const& inputEdges)
{
  std::set<size_t> emitted;
  for (auto const& edge : inputEdges) {
    if (edge.IsStrong()) {
      // Preserve strong edges
      outputEdges.push_back(edge);
    } else {
      auto const& dse = this->SideEffects[edge];

      // Add edges that have custom command side effects
      for (cmGeneratorTarget const* dep : dse.CustomCommandSideEffects) {
        auto index = this->TargetIndex[dep];
        if (!emitted.count(index)) {
          emitted.insert(index);
          outputEdges.push_back(
            cmGraphEdge(index, false, edge.IsCross(), edge.GetBacktrace()));
        }
      }

      // Add edges that have language side effects for languages we
      // care about
      for (auto const& lang : gt->GetAllConfigCompileLanguages()) {
        auto it = dse.LanguageSideEffects.find(lang);
        if (it != dse.LanguageSideEffects.end()) {
          for (cmGeneratorTarget const* dep : it->second) {
            auto index = this->TargetIndex[dep];
            if (!emitted.count(index)) {
              emitted.insert(index);
              outputEdges.push_back(cmGraphEdge(index, false, edge.IsCross(),
                                                edge.GetBacktrace()));
            }
          }
        }
      }
    }
  }
}